

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

enable_if_t<_detail::move_never<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_> *
__thiscall
pybind11::move<std::__cxx11::string>
          (enable_if_t<_detail::move_never<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
           *__return_storage_ptr__,pybind11 *this,object *obj)

{
  runtime_error *this_00;
  long *plVar1;
  size_type *psVar2;
  str local_f0;
  make_caster<std::__cxx11::basic_string<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (**(int **)this < 2) {
    detail::load_type<std::__cxx11::string>(&local_e8,(detail *)this,&obj->super_handle);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.
           super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
           .value._M_dataplus._M_p ==
        &local_e8.
         super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
         .value.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           local_e8.
           super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
           .value.field_2._M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) =
           local_e8.
           super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
           .value.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p =
           local_e8.
           super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
           .value._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           local_e8.
           super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
           .value.field_2._M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length =
         local_e8.
         super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
         .value._M_string_length;
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  str::str(&local_f0,*(PyObject **)(*(long *)this + 8));
  str::operator_cast_to_string(&local_a8,&local_f0);
  std::operator+(&local_68,"Unable to move from Python ",&local_a8);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_68);
  local_c8._M_dataplus._M_p = (pointer)*plVar1;
  psVar2 = (size_type *)(plVar1 + 2);
  if ((size_type *)local_c8._M_dataplus._M_p == psVar2) {
    local_c8.field_2._M_allocated_capacity = *psVar2;
    local_c8.field_2._8_8_ = plVar1[3];
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  }
  else {
    local_c8.field_2._M_allocated_capacity = *psVar2;
  }
  local_c8._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  type_id<std::__cxx11::string>();
  std::operator+(&local_48,&local_c8,&local_88);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_48);
  local_e8.
  super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  .value._M_dataplus._M_p = (pointer)*plVar1;
  psVar2 = (size_type *)(plVar1 + 2);
  if ((size_type *)
      local_e8.
      super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
      .value._M_dataplus._M_p == psVar2) {
    local_e8.
    super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    .value.field_2._M_allocated_capacity = *psVar2;
    local_e8.
    super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    .value.field_2._8_8_ = plVar1[3];
    local_e8.
    super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    .value._M_dataplus._M_p =
         (pointer)&local_e8.
                   super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                   .value.field_2;
  }
  else {
    local_e8.
    super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    .value.field_2._M_allocated_capacity = *psVar2;
  }
  local_e8.
  super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  .value._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_e8);
  *(undefined ***)this_00 = &PTR__runtime_error_001aeb08;
  __cxa_throw(this_00,&cast_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

detail::enable_if_t<!detail::move_never<T>::value, T> move(object &&obj) {
    if (obj.ref_count() > 1)
#if defined(NDEBUG)
        throw cast_error("Unable to cast Python instance to C++ rvalue: instance has multiple references"
            " (compile in debug mode for details)");
#else
        throw cast_error("Unable to move from Python " + (std::string) str(type::handle_of(obj)) +
                " instance to C++ " + type_id<T>() + " instance: instance has multiple references");
#endif

    // Move into a temporary and return that, because the reference may be a local value of `conv`
    T ret = std::move(detail::load_type<T>(obj).operator T&());
    return ret;
}